

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O0

GenericDatum avro::makeGenericDatum(NodePtr *n,Entity *e,SymbolTable *st)

{
  bool bVar1;
  Type TVar2;
  EntityType EVar3;
  int iVar4;
  type pNVar5;
  undefined4 extraout_var;
  size_type sVar6;
  pointer ppVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  NodePtr *schema;
  undefined8 uVar8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Entity *in_RCX;
  NodePtr *in_RDX;
  placeholder *extraout_RDX;
  placeholder *extraout_RDX_00;
  placeholder *extraout_RDX_01;
  placeholder *extraout_RDX_02;
  placeholder *extraout_RDX_03;
  placeholder *extraout_RDX_04;
  placeholder *extraout_RDX_05;
  placeholder *extraout_RDX_06;
  placeholder *extraout_RDX_07;
  placeholder *extraout_RDX_08;
  placeholder *extraout_RDX_09;
  placeholder *extraout_RDX_10;
  placeholder *extraout_RDX_11;
  placeholder *extraout_RDX_12;
  any aVar9;
  shared_ptr<avro::Node> *in_RSI;
  undefined8 in_RDI;
  GenericDatum GVar10;
  NodePtr *b;
  size_t i_1;
  const_iterator it_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
  *v_2;
  Entity e2;
  string name;
  GenericUnion result_3;
  const_iterator it_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
  *v_1;
  GenericMap result_2;
  const_iterator it_1;
  vector<avro::json::Entity,_std::allocator<avro::json::Entity>_> *elements;
  GenericArray result_1;
  const_iterator it;
  size_t i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
  *v;
  GenericRecord result;
  Type t;
  value_type *in_stack_fffffffffffff808;
  int32_t v_00;
  float v_01;
  undefined1 v_02;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff818;
  GenericUnion *in_stack_fffffffffffff820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff828;
  GenericUnion *in_stack_fffffffffffff830;
  GenericUnion *v_03;
  NodePtr *in_stack_fffffffffffff838;
  GenericEnum *in_stack_fffffffffffff840;
  GenericDatum *this_00;
  undefined7 in_stack_fffffffffffff848;
  byte in_stack_fffffffffffff84f;
  Exception *in_stack_fffffffffffff850;
  NodePtr *in_stack_fffffffffffff868;
  GenericRecord *in_stack_fffffffffffff870;
  Object *in_stack_fffffffffffff878;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff880;
  Entity *in_stack_fffffffffffff8e8;
  undefined8 in_stack_fffffffffffff918;
  ulong uVar11;
  EntityType et;
  Entity *in_stack_fffffffffffff920;
  NodePtr *in_stack_fffffffffffff988;
  GenericDatum local_470;
  undefined1 local_460 [48];
  Exception *local_430;
  ulong local_428;
  _Base_ptr local_420;
  undefined1 local_411;
  Object *local_310;
  string local_2f8 [32];
  GenericUnion local_2d8 [3];
  _Self local_260;
  _Self local_258;
  Object *local_250;
  GenericMap local_248;
  Entity *local_200;
  __normal_iterator<const_avro::json::Entity_*,_std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_>
  local_1f8;
  Array *local_1f0;
  GenericArray local_1e8 [2];
  undefined1 local_181;
  _Self local_a0;
  _Self local_98;
  ulong local_90;
  Object *local_88;
  _Base_ptr local_30;
  undefined4 in_stack_ffffffffffffffd8;
  
  et = (EntityType)((ulong)in_stack_fffffffffffff918 >> 0x20);
  pNVar5 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
  TVar2 = Node::type(pNVar5);
  if (TVar2 == AVRO_NUM_TYPES) {
    pNVar5 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
    (*pNVar5->_vptr_Node[3])();
    local_30 = (_Base_ptr)
               std::
               map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
               ::find((map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                       *)in_stack_fffffffffffff808,(key_type *)0x1dc9b1);
    std::_Rb_tree_const_iterator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>::
    operator->((_Rb_tree_const_iterator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>
                *)0x1dc9c6);
    boost::shared_ptr<avro::Node>::operator=
              ((shared_ptr<avro::Node> *)in_stack_fffffffffffff820,
               (shared_ptr<avro::Node> *)in_stack_fffffffffffff818);
    pNVar5 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
    TVar2 = Node::type(pNVar5);
  }
  switch(TVar2) {
  case AVRO_STRING:
    assertType(in_stack_fffffffffffff920,et);
    json::Entity::stringValue_abi_cxx11_((Entity *)in_stack_fffffffffffff810);
    GenericDatum::GenericDatum
              ((GenericDatum *)in_stack_fffffffffffff810,&in_stack_fffffffffffff808->first);
    aVar9.content = extraout_RDX;
    break;
  case AVRO_BYTES:
    assertType(in_stack_fffffffffffff920,et);
    json::Entity::stringValue_abi_cxx11_((Entity *)in_stack_fffffffffffff810);
    toBin((string *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    GenericDatum::GenericDatum
              ((GenericDatum *)in_stack_fffffffffffff810,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff808);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff820);
    aVar9.content = extraout_RDX_00;
    break;
  case AVRO_INT:
    assertType(in_stack_fffffffffffff920,et);
    v_00 = (int32_t)((ulong)in_stack_fffffffffffff808 >> 0x20);
    json::Entity::longValue((Entity *)in_stack_fffffffffffff810);
    GenericDatum::GenericDatum((GenericDatum *)in_stack_fffffffffffff810,v_00);
    aVar9.content = extraout_RDX_01;
    break;
  case AVRO_LONG:
    assertType(in_stack_fffffffffffff920,et);
    json::Entity::longValue((Entity *)in_stack_fffffffffffff810);
    GenericDatum::GenericDatum
              ((GenericDatum *)in_stack_fffffffffffff810,(int64_t)in_stack_fffffffffffff808);
    aVar9.content = extraout_RDX_02;
    break;
  case AVRO_FLOAT:
    assertType(in_stack_fffffffffffff920,et);
    v_01 = (float)((ulong)in_stack_fffffffffffff808 >> 0x20);
    json::Entity::doubleValue((Entity *)in_stack_fffffffffffff810);
    GenericDatum::GenericDatum((GenericDatum *)in_stack_fffffffffffff810,v_01);
    aVar9.content = extraout_RDX_03;
    break;
  case AVRO_DOUBLE:
    assertType(in_stack_fffffffffffff920,et);
    json::Entity::doubleValue((Entity *)in_stack_fffffffffffff810);
    GenericDatum::GenericDatum
              ((GenericDatum *)in_stack_fffffffffffff810,(double)in_stack_fffffffffffff808);
    aVar9.content = extraout_RDX_04;
    break;
  case AVRO_BOOL:
    assertType(in_stack_fffffffffffff920,et);
    v_02 = (undefined1)((ulong)in_stack_fffffffffffff808 >> 0x38);
    json::Entity::boolValue((Entity *)in_stack_fffffffffffff810);
    GenericDatum::GenericDatum((GenericDatum *)in_stack_fffffffffffff810,(bool)v_02);
    aVar9.content = extraout_RDX_05;
    break;
  case AVRO_NULL:
    assertType(in_stack_fffffffffffff920,et);
    GenericDatum::GenericDatum((GenericDatum *)0x1dcc01);
    aVar9.content = extraout_RDX_06;
    break;
  case AVRO_RECORD:
    assertType(in_stack_fffffffffffff920,et);
    GenericRecord::GenericRecord(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    local_88 = json::Entity::objectValue_abi_cxx11_((Entity *)in_stack_fffffffffffff810);
    local_90 = 0;
    while( true ) {
      uVar11 = local_90;
      pNVar5 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
      iVar4 = (*pNVar5->_vptr_Node[4])();
      if (CONCAT44(extraout_var,iVar4) <= uVar11) break;
      pNVar5 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
      (*pNVar5->_vptr_Node[8])(pNVar5,local_90 & 0xffffffff);
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                   *)in_stack_fffffffffffff808,(key_type *)0x1dccfb);
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                  *)in_stack_fffffffffffff808);
      bVar1 = std::operator==(&local_98,&local_a0);
      if (bVar1) {
        local_181 = 1;
        uVar8 = __cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  (in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878);
        pNVar5 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
        (*pNVar5->_vptr_Node[8])(pNVar5,local_90 & 0xffffffff);
        boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                  (in_stack_fffffffffffff810,&in_stack_fffffffffffff808->first);
        Exception::Exception
                  (in_stack_fffffffffffff850,
                   (format *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
        local_181 = 0;
        __cxa_throw(uVar8,&Exception::typeinfo,Exception::~Exception);
      }
      pNVar5 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
      (*pNVar5->_vptr_Node[5])(pNVar5,local_90 & 0xffffffff);
      boost::shared_ptr<avro::Node>::shared_ptr
                ((shared_ptr<avro::Node> *)in_stack_fffffffffffff810,
                 (shared_ptr<avro::Node> *)in_stack_fffffffffffff808);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
                    *)0x1dced2);
      makeGenericDatum(in_RDX,in_RCX,(SymbolTable *)CONCAT44(TVar2,in_stack_ffffffffffffffd8));
      GenericRecord::setFieldAt
                ((GenericRecord *)in_stack_fffffffffffff820,(size_t)in_stack_fffffffffffff818,
                 (GenericDatum *)in_stack_fffffffffffff810);
      GenericDatum::~GenericDatum((GenericDatum *)0x1dcf24);
      boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x1dcf31);
      local_90 = local_90 + 1;
    }
    GenericDatum::GenericDatum<avro::GenericRecord>
              ((GenericDatum *)in_stack_fffffffffffff840,in_stack_fffffffffffff838,
               (GenericRecord *)in_stack_fffffffffffff830);
    GenericRecord::~GenericRecord((GenericRecord *)in_stack_fffffffffffff810);
    aVar9.content = extraout_RDX_07;
    break;
  case AVRO_ENUM:
    assertType(in_stack_fffffffffffff920,et);
    json::Entity::stringValue_abi_cxx11_((Entity *)in_stack_fffffffffffff810);
    GenericEnum::GenericEnum
              (in_stack_fffffffffffff840,in_stack_fffffffffffff838,
               (string *)in_stack_fffffffffffff830);
    GenericDatum::GenericDatum<avro::GenericEnum>
              ((GenericDatum *)in_stack_fffffffffffff840,in_stack_fffffffffffff838,
               (GenericEnum *)in_stack_fffffffffffff830);
    GenericEnum::~GenericEnum((GenericEnum *)0x1dd03e);
    aVar9.content = extraout_RDX_08;
    break;
  case AVRO_ARRAY:
    assertType(in_stack_fffffffffffff920,et);
    GenericArray::GenericArray
              ((GenericArray *)in_stack_fffffffffffff810,(NodePtr *)in_stack_fffffffffffff808);
    local_1f0 = json::Entity::arrayValue((Entity *)in_stack_fffffffffffff810);
    local_1f8._M_current =
         (Entity *)
         std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>::begin
                   ((vector<avro::json::Entity,_std::allocator<avro::json::Entity>_> *)
                    in_stack_fffffffffffff808);
    while( true ) {
      local_200 = (Entity *)
                  std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>::end
                            ((vector<avro::json::Entity,_std::allocator<avro::json::Entity>_> *)
                             in_stack_fffffffffffff808);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_avro::json::Entity_*,_std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_>
                          *)in_stack_fffffffffffff810,
                         (__normal_iterator<const_avro::json::Entity_*,_std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_>
                          *)in_stack_fffffffffffff808);
      if (!bVar1) break;
      GenericArray::value(local_1e8);
      pNVar5 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
      (*pNVar5->_vptr_Node[5])(pNVar5,0);
      boost::shared_ptr<avro::Node>::shared_ptr
                ((shared_ptr<avro::Node> *)in_stack_fffffffffffff810,
                 (shared_ptr<avro::Node> *)in_stack_fffffffffffff808);
      __gnu_cxx::
      __normal_iterator<const_avro::json::Entity_*,_std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_>
      ::operator*(&local_1f8);
      makeGenericDatum(in_RDX,in_RCX,(SymbolTable *)CONCAT44(TVar2,in_stack_ffffffffffffffd8));
      std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::push_back
                ((vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *)
                 in_stack_fffffffffffff810,(value_type *)in_stack_fffffffffffff808);
      GenericDatum::~GenericDatum((GenericDatum *)0x1dd1ab);
      boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x1dd1b8);
      __gnu_cxx::
      __normal_iterator<const_avro::json::Entity_*,_std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_>
      ::operator++(&local_1f8);
    }
    GenericDatum::GenericDatum<avro::GenericArray>
              ((GenericDatum *)in_stack_fffffffffffff840,in_stack_fffffffffffff838,
               (GenericArray *)in_stack_fffffffffffff830);
    GenericArray::~GenericArray((GenericArray *)in_stack_fffffffffffff810);
    aVar9.content = extraout_RDX_09;
    break;
  case AVRO_MAP:
    assertType(in_stack_fffffffffffff920,et);
    GenericMap::GenericMap
              ((GenericMap *)in_stack_fffffffffffff810,(NodePtr *)in_stack_fffffffffffff808);
    local_250 = json::Entity::objectValue_abi_cxx11_((Entity *)in_stack_fffffffffffff810);
    local_258._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                  *)in_stack_fffffffffffff808);
    while( true ) {
      local_260._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                  *)in_stack_fffffffffffff808);
      bVar1 = std::operator!=(&local_258,&local_260);
      if (!bVar1) break;
      GenericMap::value_abi_cxx11_(&local_248);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
                    *)0x1dd323);
      pNVar5 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
      (*pNVar5->_vptr_Node[5])(pNVar5,1);
      boost::shared_ptr<avro::Node>::shared_ptr
                ((shared_ptr<avro::Node> *)in_stack_fffffffffffff810,
                 (shared_ptr<avro::Node> *)in_stack_fffffffffffff808);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
                    *)0x1dd37a);
      makeGenericDatum(in_RDX,in_RCX,(SymbolTable *)CONCAT44(TVar2,in_stack_ffffffffffffffd8));
      std::make_pair<std::__cxx11::string_const&,avro::GenericDatum>
                (in_stack_fffffffffffff818,(GenericDatum *)in_stack_fffffffffffff810);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
      ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
                   *)in_stack_fffffffffffff810,in_stack_fffffffffffff808);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>
               *)in_stack_fffffffffffff810);
      GenericDatum::~GenericDatum((GenericDatum *)0x1dd3ed);
      boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x1dd3fa);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
                    *)in_stack_fffffffffffff810);
    }
    GenericDatum::GenericDatum<avro::GenericMap>
              ((GenericDatum *)in_stack_fffffffffffff840,in_stack_fffffffffffff838,
               (GenericMap *)in_stack_fffffffffffff830);
    GenericMap::~GenericMap((GenericMap *)in_stack_fffffffffffff810);
    aVar9.content = extraout_RDX_10;
    break;
  case AVRO_UNION:
    GenericUnion::GenericUnion(in_stack_fffffffffffff830,(NodePtr *)in_stack_fffffffffffff828);
    std::__cxx11::string::string(local_2f8);
    json::Entity::Entity((Entity *)0x1dd500);
    EVar3 = json::Entity::type((Entity *)in_RDX);
    if (EVar3 == etNull) {
      std::__cxx11::string::operator=(local_2f8,"null");
      json::Entity::operator=
                ((Entity *)in_stack_fffffffffffff810,(Entity *)in_stack_fffffffffffff808);
    }
    else {
      assertType(in_stack_fffffffffffff920,et);
      in_stack_fffffffffffff878 =
           json::Entity::objectValue_abi_cxx11_((Entity *)in_stack_fffffffffffff810);
      local_310 = in_stack_fffffffffffff878;
      sVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                      *)0x1dd5ba);
      if (sVar6 != 1) {
        local_411 = 1;
        uVar8 = __cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  (in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878);
        json::Entity::toString_abi_cxx11_(in_stack_fffffffffffff8e8);
        boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                  (in_stack_fffffffffffff810,&in_stack_fffffffffffff808->first);
        Exception::Exception
                  (in_stack_fffffffffffff850,
                   (format *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
        local_411 = 0;
        __cxa_throw(uVar8,&Exception::typeinfo,Exception::~Exception);
      }
      local_420 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                  ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                           *)in_stack_fffffffffffff808);
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
                             *)0x1dd6f1);
      std::__cxx11::string::operator=(local_2f8,(string *)ppVar7);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>
                    *)0x1dd710);
      json::Entity::operator=
                ((Entity *)in_stack_fffffffffffff810,(Entity *)in_stack_fffffffffffff808);
    }
    local_428 = 0;
    while( true ) {
      uVar11 = local_428;
      pNVar5 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
      iVar4 = (*pNVar5->_vptr_Node[4])();
      if (CONCAT44(extraout_var_00,iVar4) <= uVar11) {
        uVar8 = __cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  (in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878);
        json::Entity::toString_abi_cxx11_(in_stack_fffffffffffff8e8);
        boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                  (in_stack_fffffffffffff810,&in_stack_fffffffffffff808->first);
        Exception::Exception
                  (in_stack_fffffffffffff850,
                   (format *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
        __cxa_throw(uVar8,&Exception::typeinfo,Exception::~Exception);
      }
      pNVar5 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
      iVar4 = (*pNVar5->_vptr_Node[5])(pNVar5,local_428 & 0xffffffff);
      in_stack_fffffffffffff850 = (Exception *)CONCAT44(extraout_var_01,iVar4);
      local_430 = in_stack_fffffffffffff850;
      nameof_abi_cxx11_(in_stack_fffffffffffff988);
      in_stack_fffffffffffff84f =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff830,in_stack_fffffffffffff828);
      std::__cxx11::string::~string((string *)(local_460 + 0x10));
      if ((in_stack_fffffffffffff84f & 1) != 0) break;
      local_428 = local_428 + 1;
    }
    GenericUnion::selectBranch(in_stack_fffffffffffff820,(size_t)in_stack_fffffffffffff818);
    this_00 = &local_470;
    boost::shared_ptr<avro::Node>::shared_ptr
              ((shared_ptr<avro::Node> *)in_stack_fffffffffffff810,
               (shared_ptr<avro::Node> *)in_stack_fffffffffffff808);
    makeGenericDatum(in_RDX,in_RCX,(SymbolTable *)CONCAT44(TVar2,in_stack_ffffffffffffffd8));
    schema = (NodePtr *)GenericUnion::datum(local_2d8);
    v_03 = (GenericUnion *)local_460;
    GenericDatum::operator=
              ((GenericDatum *)in_stack_fffffffffffff810,(GenericDatum *)in_stack_fffffffffffff808);
    GenericDatum::~GenericDatum((GenericDatum *)0x1dd87c);
    boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x1dd889);
    GenericDatum::GenericDatum<avro::GenericUnion>(this_00,schema,v_03);
    json::Entity::~Entity((Entity *)0x1dd8b5);
    std::__cxx11::string::~string(local_2f8);
    GenericUnion::~GenericUnion((GenericUnion *)in_stack_fffffffffffff810);
    aVar9.content = extraout_RDX_11;
    break;
  case AVRO_FIXED:
    assertType(in_stack_fffffffffffff920,et);
    json::Entity::stringValue_abi_cxx11_((Entity *)in_stack_fffffffffffff810);
    toBin((string *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    GenericFixed::GenericFixed
              ((GenericFixed *)in_stack_fffffffffffff830,(NodePtr *)in_stack_fffffffffffff828,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff820);
    GenericDatum::GenericDatum<avro::GenericFixed>
              ((GenericDatum *)in_stack_fffffffffffff840,in_stack_fffffffffffff838,
               (GenericFixed *)in_stack_fffffffffffff830);
    GenericFixed::~GenericFixed((GenericFixed *)in_stack_fffffffffffff810);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff820);
    aVar9.content = extraout_RDX_12;
    break;
  default:
    this = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x18);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
              (this,(Type *)in_stack_fffffffffffff808);
    Exception::Exception
              (in_stack_fffffffffffff850,
               (format *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
  }
  GVar10.value_.content = aVar9.content;
  GVar10._0_8_ = in_RDI;
  return GVar10;
}

Assistant:

static GenericDatum makeGenericDatum(NodePtr n, const Entity& e,
    const SymbolTable& st)
{
    Type t = n->type();
    if (t == AVRO_SYMBOLIC) {
        n = st.find(n->name())->second;
        t = n->type();
    }
    switch (t) {
    case AVRO_STRING:
        assertType(e, json::etString);
        return GenericDatum(e.stringValue());
    case AVRO_BYTES:
        assertType(e, json::etString);
        return GenericDatum(toBin(e.stringValue()));
    case AVRO_INT:
        assertType(e, json::etLong);
        return GenericDatum(static_cast<int32_t>(e.longValue()));
    case AVRO_LONG:
        assertType(e, json::etLong);
        return GenericDatum(e.longValue());
    case AVRO_FLOAT:
        assertType(e, json::etDouble);
        return GenericDatum(static_cast<float>(e.doubleValue()));
    case AVRO_DOUBLE:
        assertType(e, json::etDouble);
        return GenericDatum(e.doubleValue());
    case AVRO_BOOL:
        assertType(e, json::etBool);
        return GenericDatum(e.boolValue());
    case AVRO_NULL:
        assertType(e, json::etNull);
        return GenericDatum();
    case AVRO_RECORD:
    {
        assertType(e, json::etObject);
        GenericRecord result(n);
        const map<string, Entity>& v = e.objectValue();
        for (size_t i = 0; i < n->leaves(); ++i) {
            map<string, Entity>::const_iterator it = v.find(n->nameAt(i));
            if (it == v.end()) {
                throw Exception(boost::format(
                    "No value found in default for %1%") % n->nameAt(i));
            }
            result.setFieldAt(i,
                makeGenericDatum(n->leafAt(i), it->second, st));
        }
        return GenericDatum(n, result);
    }
    case AVRO_ENUM:
        assertType(e, json::etString);
        return GenericDatum(n, GenericEnum(n, e.stringValue()));
    case AVRO_ARRAY:
    {
        assertType(e, json::etArray);
        GenericArray result(n);
        const vector<Entity>& elements = e.arrayValue();
        for (vector<Entity>::const_iterator it = elements.begin();
            it != elements.end(); ++it) {
            result.value().push_back(makeGenericDatum(n->leafAt(0), *it, st));
        }
        return GenericDatum(n, result);
    }
    case AVRO_MAP:
    {
        assertType(e, json::etObject);
        GenericMap result(n);
        const map<string, Entity>& v = e.objectValue();
        for (map<string, Entity>::const_iterator it = v.begin();
            it != v.end(); ++it) {
            result.value().push_back(make_pair(it->first,
                makeGenericDatum(n->leafAt(1), it->second, st)));
        }
        return GenericDatum(n, result);
    }
    case AVRO_UNION:
    {
        GenericUnion result(n);
        string name;
        Entity e2;
        if (e.type() == json::etNull) {
            name = "null";
            e2 = e;
        } else {
            assertType(e, json::etObject);
            const map<string, Entity>& v = e.objectValue();
            if (v.size() != 1) {
                throw Exception(boost::format("Default value for "
                    "union has more than one field: %1%") % e.toString());
            }
            map<string, Entity>::const_iterator it = v.begin();
            name = it->first;
            e2 = it->second;
        }
        for (size_t i = 0; i < n->leaves(); ++i) {
            const NodePtr& b = n->leafAt(i);
            if (nameof(b) == name) {
                result.selectBranch(i);
                result.datum() = makeGenericDatum(b, e2, st);
                return GenericDatum(n, result);
            }
        }
        throw Exception(boost::format("Invalid default value %1%") %
            e.toString());
    }
    case AVRO_FIXED:
        assertType(e, json::etString);
        return GenericDatum(n, GenericFixed(n, toBin(e.stringValue())));
    default:
        throw Exception(boost::format("Unknown type: %1%") % t);
    }
    return GenericDatum();
}